

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O3

IntersectionData * vera::intersection(Plane *_plane1,Plane *_plane2)

{
  IntersectionData *in_RDI;
  
  in_RDI->distance = 0.0;
  in_RDI->hit = false;
  return in_RDI;
}

Assistant:

IntersectionData intersection(const Plane& _plane1, const Plane& _plane2) {
    IntersectionData idata;
    
    glm::vec3 n1 = _plane1.getNormal();
    glm::vec3 n2 = _plane2.getNormal();
    float d1 = _plane1.getDCoeff();
    float d2 = _plane2.getDCoeff();
    
    // Check if planes are parallel, if so return false:
    glm::vec3 dir= glm::cross(_plane1.getNormal(),_plane2.getNormal());
    
    idata.hit = dir.length() < EPS;

    if (idata.hit) {
        // Direction of intersection is the cross product of the two normals:
        dir = glm::normalize(dir);
        
        // Thank you Toxi!
        float offDiagonal = glm::dot(n1,n2);
        float det = 1.0 / (1 - offDiagonal * offDiagonal);
        float a = (d1 - d2 * offDiagonal) * det;
        float b = (d2 - d1 * offDiagonal) * det;
        glm::vec3 anchor = glm::normalize(n1) * a + glm::normalize(n2) * b;
        
        idata.position = anchor;
        idata.direction = dir;
    }
    
    return idata;
}